

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getconf.cc
# Opt level: O1

result_t * getconfFunc(result_t *__return_storage_ptr__,Env *env,GetconfArgument *args)

{
  int iVar1;
  result_t *prVar2;
  Env *pEVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  runtime_error *this;
  int iVar7;
  float fVar8;
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int DBASE_MAXITEM;
  int DBASE_NUM_TRANS;
  int custid;
  float DBASE_AVG_TRANS_SZ;
  int DBASE_NUM_CUST;
  int nitem;
  float DBASE_AVG_CUST_SZ;
  int DBASE_MAXTRANS;
  int DBASE_MINTRANS;
  int tid;
  result_t *result;
  int *buf;
  string error_message;
  DbaseCtrlBlk dcb;
  ofstream conffd;
  int local_2d4;
  float local_2d0;
  int local_2cc;
  float local_2c8;
  int local_2c4;
  int local_2c0;
  float local_2bc;
  int local_2b8;
  int local_2b4;
  GetconfArgument *local_2b0;
  int local_2a4;
  result_t *local_2a0;
  int *local_298;
  double local_290;
  Env *local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  DbaseCtrlBlk local_260;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  local_2d0 = 0.0;
  local_2d4 = 0;
  local_2c4 = 0;
  local_2b4 = 0;
  local_2b8 = 0;
  local_2c8 = 0.0;
  local_2bc = 0.0;
  local_2cc = 0;
  local_2a4 = 0;
  local_2c0 = 0;
  local_298 = (int *)0x0;
  local_2b0 = args;
  local_2a0 = __return_storage_ptr__;
  local_288 = env;
  DbaseCtrlBlk::init(&local_260,(EVP_PKEY_CTX *)args);
  DbaseCtrlBlk::get_first_blk(&local_260);
  DbaseCtrlBlk::get_next_trans(&local_260,&local_298,&local_2c0,&local_2a4,&local_2cc);
  local_2b4 = local_2cc;
  iVar12 = -1;
  fVar8 = 0.0;
  iVar13 = 0;
  iVar14 = 0;
  iVar4 = 0;
  iVar9 = 0;
  while (local_260.readall != '\x01') {
    local_2b8 = local_2cc;
    if ((iVar12 != local_2cc & local_2b0->use_seq) == 1) {
      local_2c4 = local_2c4 + 1;
      iVar14 = (iVar14 - (int)fVar8) + (int)local_2d0;
      iVar12 = local_2cc;
      fVar8 = local_2d0;
    }
    local_2d0 = (float)((int)local_2d0 + 1);
    if (iVar9 < local_2c0) {
      iVar9 = local_2c0;
    }
    if (0 < (long)local_2c0) {
      lVar10 = 0;
      iVar7 = local_2d4;
      do {
        iVar1 = local_298[lVar10];
        if (iVar7 < iVar1) {
          iVar7 = iVar1;
          local_2d4 = iVar1;
        }
        lVar10 = lVar10 + 1;
      } while (local_2c0 != lVar10);
    }
    iVar13 = iVar13 + local_2c0;
    iVar4 = local_2c0 * local_2c0 + iVar4;
    DbaseCtrlBlk::get_next_trans(&local_260,&local_298,&local_2c0,&local_2a4,&local_2cc);
  }
  local_2d4 = local_2d4 + 1;
  if (local_2b0->use_seq == true) {
    local_2bc = (float)((iVar14 - (int)fVar8) + (int)local_2d0) / (float)local_2c4;
  }
  local_2c8 = (float)((double)iVar13 / (double)(int)local_2d0);
  local_290 = (double)iVar4 / (double)(int)local_2d0 - (double)(local_2c8 * local_2c8);
  if (local_290 < 0.0) {
    local_290 = sqrt(local_290);
  }
  else {
    local_290 = SQRT(local_290);
  }
  pEVar3 = local_288;
  prVar2 = local_2a0;
  std::ofstream::ofstream(&local_230,(local_2b0->confn)._M_dataplus._M_p,_S_out|_S_bin);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    if (local_2b0->use_seq == true) {
      std::ostream::write((char *)&local_230,(long)&local_2c4);
      std::ostream::write((char *)&local_230,(long)&local_2d4);
      std::ostream::write((char *)&local_230,(long)&local_2bc);
      std::ostream::write((char *)&local_230,(long)&local_2c8);
      pfVar11 = &local_2d0;
    }
    else {
      std::ostream::write((char *)&local_230,(long)&local_2d0);
      std::ostream::write((char *)&local_230,(long)&local_2d4);
      pfVar11 = &local_2c8;
    }
    std::ostream::write((char *)&local_230,(long)pfVar11);
    std::ostream::write((char *)&local_230,(long)&local_2b4);
    std::ostream::write((char *)&local_230,(long)&local_2b8);
    std::ofstream::close();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pEVar3->summary,"CONF ",5);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&pEVar3->summary,local_2c4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_2d4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<double>((double)local_2bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<double>((double)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(int)local_2d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_2b4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,local_2b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = std::ostream::_M_insert<double>(local_290);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,iVar9);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    (prVar2->seqstrm)._M_dataplus._M_p = (pointer)&(prVar2->seqstrm).field_2;
    (prVar2->seqstrm)._M_string_length = 0;
    (prVar2->seqstrm).field_2._M_local_buf[0] = '\0';
    (prVar2->logger)._M_dataplus._M_p = (pointer)&(prVar2->logger).field_2;
    (prVar2->logger)._M_string_length = 0;
    (prVar2->logger).field_2._M_local_buf[0] = '\0';
    (prVar2->summary)._M_dataplus._M_p = (pointer)&(prVar2->summary).field_2;
    (prVar2->summary)._M_string_length = 0;
    (prVar2->summary).field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&prVar2->logger,(string *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&prVar2->summary,(string *)&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    DbaseCtrlBlk::~DbaseCtrlBlk(&local_260);
    return prVar2;
  }
  std::operator+(&local_280,"can\'t open file: ",&local_2b0->confn);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,(string *)&local_280);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

result_t getconfFunc(Env& env, const GetconfArgument& args) {
    int DBASE_NUM_TRANS = 0;
    int DBASE_MAXITEM = 0;
    int DBASE_NUM_CUST = 0;
    int DBASE_MINTRANS = 0;
    int DBASE_MAXTRANS = 0;
    float DBASE_AVG_TRANS_SZ = 0;
    float DBASE_AVG_CUST_SZ = 0;

    int i;

    int custid = 0, tid = 0, nitem = 0;
    int *buf = nullptr;
    int oldcustid = -1;
    int oldtcnt = 0;
    int tsizesum = 0;
    int tcustsum = 0;
    int tsizesq = 0;
    int maxnitem = 0;

    DbaseCtrlBlk dcb;
    dcb.init(args.input);

    dcb.get_first_blk();
    dcb.get_next_trans(buf, nitem, tid, custid);
    DBASE_MINTRANS = custid;
    while (!dcb.eof()) {
        //printf ("%d %d %d\n", custid, tid, nitem);
        DBASE_MAXTRANS = custid;
        if (args.use_seq) {
            if (oldcustid != custid) {
                tcustsum += DBASE_NUM_TRANS - oldtcnt;
                oldtcnt = DBASE_NUM_TRANS;
                DBASE_NUM_CUST++;
                oldcustid = custid;
            }
        }
        DBASE_NUM_TRANS++;
        tsizesum += nitem;
        if (nitem > maxnitem) maxnitem = nitem;

        tsizesq += (nitem * nitem);
        for (i = 0; i < nitem; i++)
            if (buf[i] > DBASE_MAXITEM) DBASE_MAXITEM = buf[i];
        dcb.get_next_trans(buf, nitem, tid, custid);
    }
    tcustsum += DBASE_NUM_TRANS - oldtcnt;
    DBASE_MAXITEM++;

    if (args.use_seq) {
        DBASE_AVG_CUST_SZ = (1.0 * tcustsum) / DBASE_NUM_CUST;
    }
    DBASE_AVG_TRANS_SZ = (1.0 * tsizesum) / DBASE_NUM_TRANS;
    double trans_sq_avg = (1.0 * tsizesq) / DBASE_NUM_TRANS;
    double stddev = sqrt(trans_sq_avg - (DBASE_AVG_TRANS_SZ * DBASE_AVG_TRANS_SZ));


    //write config info to new file
    ofstream conffd(args.confn.c_str(), ios::binary | ios::out);

    if (!conffd) {
        string error_message = "can't open file: " + args.confn;
        throw runtime_error(error_message);
    }

    if (args.use_seq) {
        conffd.write((char *) &DBASE_NUM_CUST, INT_SIZE);
        conffd.write((char *) &DBASE_MAXITEM, INT_SIZE);
        conffd.write((char *) &DBASE_AVG_CUST_SZ, sizeof(float));
        conffd.write((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        conffd.write((char *) &DBASE_NUM_TRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MINTRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXTRANS, INT_SIZE);
    } else {
        conffd.write((char *) &DBASE_NUM_TRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXITEM, INT_SIZE);
        conffd.write((char *) &DBASE_AVG_TRANS_SZ, sizeof(float));
        conffd.write((char *) &DBASE_MINTRANS, INT_SIZE);
        conffd.write((char *) &DBASE_MAXTRANS, INT_SIZE);
    }

    conffd.close();
    env.summary << "CONF " << DBASE_NUM_CUST << " " << DBASE_MAXITEM << " " << DBASE_AVG_CUST_SZ
            << " " << DBASE_AVG_TRANS_SZ << " " << DBASE_NUM_TRANS << " " << DBASE_MINTRANS
            << " " << DBASE_MAXTRANS << " " << stddev << " " << maxnitem << endl;

    result_t result;
    result.logger = env.logger.str();
    result.summary = env.summary.str();
    return result;
}